

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall
QActionPrivate::setShortcutEnabled(QActionPrivate *this,bool enable,QShortcutMap *map)

{
  int id;
  QObject *owner;
  int *piVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  owner = *(QObject **)&this->field_0x8;
  piVar1 = (this->shortcutIds).d.ptr;
  lVar2 = (this->shortcutIds).d.size;
  for (lVar3 = 0; lVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    id = *(int *)((long)piVar1 + lVar3);
    if (id != 0) {
      QKeySequence::QKeySequence(&local_40);
      QShortcutMap::setShortcutEnabled(map,enable,id,owner,&local_40);
      QKeySequence::~QKeySequence(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QActionPrivate::setShortcutEnabled(bool enable, QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.setShortcutEnabled(enable, id, q);
    }
}